

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::PrimitiveTypeHelper<9>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  CodedOutputStream *this;
  void *in_RSI;
  Type *value;
  undefined8 in_stack_ffffffffffffffd8;
  uint32 value_00;
  void *data;
  CodedOutputStream *in_stack_ffffffffffffffe0;
  
  value_00 = (uint32)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  std::__cxx11::string::size();
  io::CodedOutputStream::WriteVarint32(in_stack_ffffffffffffffe0,value_00);
  data = in_RSI;
  this = (CodedOutputStream *)std::__cxx11::string::data();
  std::__cxx11::string::size();
  io::CodedOutputStream::WriteRawMaybeAliased(this,data,(int)((ulong)in_RSI >> 0x20));
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    const Type& value = *static_cast<const Type*>(ptr);
    output->WriteVarint32(value.size());
    output->WriteRawMaybeAliased(value.data(), value.size());
  }